

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

int ON_SubDFaceCornerDex::Compare(ON_SubDFaceCornerDex *lhs,ON_SubDFaceCornerDex *rhs)

{
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDFaceCornerDex *)0x0) {
    return 1;
  }
  if (rhs != (ON_SubDFaceCornerDex *)0x0) {
    if (rhs->m_edge_count <= lhs->m_edge_count) {
      if (rhs->m_edge_count < lhs->m_edge_count) {
        return 1;
      }
      if (lhs->m_corner_index < rhs->m_corner_index) {
        return -1;
      }
      return (uint)(rhs->m_corner_index < lhs->m_corner_index);
    }
  }
  return -1;
}

Assistant:

int ON_SubDFaceCornerDex::Compare(const ON_SubDFaceCornerDex* lhs, const ON_SubDFaceCornerDex* rhs)
{
  // sort nullptr to end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  return ON_SubDFaceCornerDex::CompareAll(*lhs, *rhs);
}